

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaLib.cpp
# Opt level: O3

string * __thiscall
xmrig::CudaLib::version_abi_cxx11_(string *__return_storage_ptr__,CudaLib *this,uint32_t version)

{
  size_type *psVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  string __str_1;
  string __str;
  ulong *local_88;
  uint local_80;
  undefined4 uStack_7c;
  ulong local_78 [2];
  ulong *local_68;
  long local_60;
  ulong local_58;
  long lStack_50;
  char *local_48;
  uint local_40;
  char local_38 [16];
  
  uVar11 = ((ulong)this & 0xffffffff) / 1000;
  cVar4 = '\x01';
  iVar10 = (int)uVar11;
  if (9999 < (uint)this) {
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0016c8dc;
      }
      if (uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0016c8dc;
      }
      if (uVar8 < 10000) goto LAB_0016c8dc;
      uVar11 = uVar11 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (99999 < uVar8);
    cVar4 = cVar4 + '\x01';
  }
LAB_0016c8dc:
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_48,local_40,(uint)(((ulong)this & 0xffffffff) / 1000));
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
  uVar8 = (uint)this + iVar10 * -1000;
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_58 = *puVar7;
    lStack_50 = plVar5[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *puVar7;
    local_68 = (ulong *)*plVar5;
  }
  local_60 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_88 = local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,'\x02' - (uVar8 < 100));
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_88,local_80,(uVar8 & 0xffff) / 10);
  uVar11 = CONCAT44(uStack_7c,local_80) + local_60;
  uVar9 = 0xf;
  if (local_68 != &local_58) {
    uVar9 = local_58;
  }
  if (uVar9 < uVar11) {
    uVar9 = 0xf;
    if (local_88 != local_78) {
      uVar9 = local_78[0];
    }
    if (uVar11 <= uVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_68);
      goto LAB_0016c9f3;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88);
LAB_0016c9f3:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar2 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string xmrig::CudaLib::version(uint32_t version)
{
    return std::to_string(version / 1000) + "." + std::to_string((version % 1000) / 10);
}